

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Viper.cpp
# Opt level: O2

shared_ptr<chrono::ChLinkTSDA> __thiscall
chrono::viper::AddSuspensionSpring
          (viper *this,shared_ptr<chrono::ChBodyAuxRef> *body1,
          shared_ptr<chrono::ChBodyAuxRef> *body2,shared_ptr<chrono::viper::ViperChassis> *chassis,
          ChVector<double> *pos1,ChVector<double> *pos2)

{
  undefined8 uVar1;
  long lVar2;
  long *plVar3;
  ChFrame<double> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<chrono::ChLinkTSDA> sVar4;
  ChVector<double> p1;
  ChVector<double> p2;
  __shared_ptr<chrono::ChLinkTSDA,_(__gnu_cxx::_Lock_policy)2> local_e8;
  ChVector<double> local_d8;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *local_c0;
  __shared_ptr<chrono::ChLinkBase,(__gnu_cxx::_Lock_policy)2> local_b8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  __shared_ptr<chrono::ChBody,(__gnu_cxx::_Lock_policy)2> local_a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  __shared_ptr<chrono::ChBody,(__gnu_cxx::_Lock_policy)2> local_98 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  ChVector<double> local_88;
  double local_68;
  double dStack_60;
  double local_58;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  double local_38;
  
  local_c0 = &body2->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)&local_d8,
             &(((chassis->
                super___shared_ptr<chrono::viper::ViperChassis,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
              ->super_ViperPart).m_body.
              super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
  this_00 = (ChFrame<double> *)(**(code **)(*(long *)local_d8.m_data[0] + 0x1f0))();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8.m_data + 1));
  ChFrame<double>::TransformPointLocalToParent(&local_d8,this_00,pos1);
  ChFrame<double>::TransformPointLocalToParent(&local_88,this_00,pos2);
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  std::make_shared<chrono::ChLinkTSDA>();
  std::__shared_ptr<chrono::ChLinkTSDA,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChLinkTSDA,_(__gnu_cxx::_Lock_policy)2> *)this,&local_e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8._M_refcount);
  uVar1 = *(undefined8 *)this;
  std::__shared_ptr<chrono::ChBody,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChBodyAuxRef,void>
            (local_98,&body1->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::ChBody,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChBodyAuxRef,void>(local_a8,local_c0);
  local_48 = (element_type *)local_d8.m_data[0];
  p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8.m_data[1];
  local_38 = local_d8.m_data[2];
  local_68 = local_88.m_data[0];
  dStack_60 = local_88.m_data[1];
  local_58 = local_88.m_data[2];
  chrono::ChLinkTSDA::Initialize(uVar1,local_98,local_a8,0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90);
  lVar2 = *(long *)this;
  *(undefined8 *)(lVar2 + 0x140) = 0x41286a0000000000;
  *(undefined8 *)(lVar2 + 0x148) = 0x40c3880000000000;
  std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)&local_e8,
             &(((chassis->
                super___shared_ptr<chrono::viper::ViperChassis,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
              ->super_ViperPart).m_body.
              super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
  plVar3 = *(long **)(local_e8._M_ptr + 0x38);
  std::__shared_ptr<chrono::ChLinkBase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChLinkTSDA,void>
            (local_b8,(__shared_ptr<chrono::ChLinkTSDA,_(__gnu_cxx::_Lock_policy)2> *)this);
  (**(code **)(*plVar3 + 0x138))(plVar3,local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8._M_refcount);
  sVar4.super___shared_ptr<chrono::ChLinkTSDA,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.super___shared_ptr<chrono::ChLinkTSDA,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chrono::ChLinkTSDA>)
         sVar4.super___shared_ptr<chrono::ChLinkTSDA,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ChLinkTSDA> AddSuspensionSpring(std::shared_ptr<ChBodyAuxRef> body1,
                                                std::shared_ptr<ChBodyAuxRef> body2,
                                                std::shared_ptr<ViperChassis> chassis,
                                                const ChVector<>& pos1,
                                                const ChVector<>& pos2) {
    const ChFrame<>& X_GP = chassis->GetBody()->GetFrame_REF_to_abs();
    auto p1 = X_GP.TransformPointLocalToParent(pos1);
    auto p2 = X_GP.TransformPointLocalToParent(pos2);

    std::shared_ptr<ChLinkTSDA> spring;
    spring = chrono_types::make_shared<ChLinkTSDA>();
    spring->Initialize(body1, body2, false, p1, p2);
    spring->SetSpringCoefficient(800000.0);
    spring->SetDampingCoefficient(10000.0);
    chassis->GetBody()->GetSystem()->AddLink(spring);
    return spring;
}